

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkLayer::InternalSwap
          (NeuralNetworkLayer *this,NeuralNetworkLayer *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  NeuralNetworkLayer *other_local;
  NeuralNetworkLayer *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap(&this->input_,&other->input_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap(&this->output_,&other->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::InternalSwap
            (&this->inputtensor_,&other->inputtensor_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::InternalSwap
            (&this->outputtensor_,&other->outputtensor_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (default_value,&this->name_,rhs_arena_00,&other->name_,lhs_arena_00);
  std::swap<bool>(&this->isupdatable_,&other->isupdatable_);
  std::swap<CoreML::Specification::NeuralNetworkLayer::LayerUnion>(&this->layer_,&other->layer_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  return;
}

Assistant:

void NeuralNetworkLayer::InternalSwap(NeuralNetworkLayer* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  input_.InternalSwap(&other->input_);
  output_.InternalSwap(&other->output_);
  inputtensor_.InternalSwap(&other->inputtensor_);
  outputtensor_.InternalSwap(&other->outputtensor_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &name_, lhs_arena,
      &other->name_, rhs_arena
  );
  swap(isupdatable_, other->isupdatable_);
  swap(layer_, other->layer_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}